

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

void __thiscall kratos::Var::set_size_param(Var *this,uint32_t index,Var *param)

{
  unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>
  *this_00;
  pointer psVar1;
  Var *pVVar2;
  int iVar3;
  uint64_t uVar4;
  mapped_type *ppVVar5;
  iterator iVar6;
  VarException *this_01;
  UserException *pUVar7;
  size_type *psVar8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  pointer psVar9;
  basic_string_view<char> bVar10;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  initializer_list<const_kratos::IRNode_*> __l;
  element_type *local_130;
  Var *local_128;
  undefined1 local_120 [8];
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  slice_index;
  ParamVisitor visitor;
  string local_60;
  Var *local_40;
  allocator_type local_35;
  uint32_t local_34 [2];
  uint32_t index_local;
  
  local_34[0] = index;
  if ((this->type_ & ~PortIO) != Base) {
    pUVar7 = (UserException *)__cxa_allocate_exception(0x10);
    (*(this->super_IRNode)._vptr_IRNode[0x1f])(&local_60,this);
    visitor.params_._M_h._M_single_bucket = (__node_base_ptr)local_60._M_dataplus._M_p;
    bVar10 = fmt::v7::to_string_view<char,_0>("{0} is not a variable or port");
    format_str_01.data_ = (char *)bVar10.size_;
    format_str_01.size_ = 0xd;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&visitor.params_._M_h._M_single_bucket;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)
               &slice_index.
                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(detail *)bVar10.data_,
               format_str_01,args_01);
    UserException::UserException
              (pUVar7,(string *)
                      &slice_index.
                       super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __cxa_throw(pUVar7,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((ulong)index <
      (ulong)((long)(this->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2)) {
    if (param == (Var *)0x0) {
      this_00 = &this->size_param_;
      iVar6 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_kratos::Var_*>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&this_00->_M_h,local_34);
      if (iVar6.super__Node_iterator_base<std::pair<const_unsigned_int,_kratos::Var_*>,_false>.
          _M_cur == (__node_type *)0x0) {
        return;
      }
      ppVVar5 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_kratos::Var_*>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_kratos::Var_*>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)this_00,local_34);
      pVVar2 = *ppVVar5;
      visitor.super_IRVisitor._8_8_ =
           &visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
      visitor.super_IRVisitor._vptr_IRVisitor =
           (_func_int **)((ulong)visitor.super_IRVisitor._vptr_IRVisitor._4_4_ << 0x20);
      visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
      visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
      visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
      visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
      visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
      slice_index.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&PTR_visit_root_002abd20;
      visitor.super_IRVisitor.visited_._M_h._M_single_bucket =
           (__node_base_ptr)&visitor.params_._M_h._M_rehash_policy._M_next_resize;
      visitor.params_._M_h._M_buckets = (__buckets_ptr)0x1;
      visitor.params_._M_h._M_bucket_count = 0;
      visitor.params_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      visitor.params_._M_h._M_element_count._0_4_ = 0x3f800000;
      visitor.params_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      visitor.params_._M_h._M_rehash_policy._4_4_ = 0;
      visitor.params_._M_h._M_rehash_policy._M_next_resize = 0;
      IRVisitor::visit_root
                ((IRVisitor *)
                 &slice_index.
                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&pVVar2->super_IRNode);
      psVar8 = &visitor.params_._M_h._M_bucket_count;
      while (psVar8 = (size_type *)*psVar8, psVar8 != (size_type *)0x0) {
        Param::remove_param_size_var
                  ((Param *)((__node_base *)(psVar8 + 1))->_M_nxt,this,local_34[0],pVVar2);
      }
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_kratos::Var_*>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase(&this_00->_M_h,local_34);
    }
    else {
      uVar4 = Simulator::static_evaluate_expr(param);
      psVar1 = (this->slices_).
               super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_40 = this;
      for (psVar9 = (this->slices_).
                    super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pVVar2 = local_40, psVar9 != psVar1;
          psVar9 = psVar9 + 1) {
        iVar3 = (*(((psVar9->super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->super_Var).super_IRNode._vptr_IRNode[0x2b])();
        if ((char)iVar3 == '\0') {
          (*(((psVar9->super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_Var).super_IRNode._vptr_IRNode[0x24])
                    ((_Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                      *)local_120);
          if (((ulong)local_34[0] <
               (ulong)((long)slice_index.
                             super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start - (long)local_120 >> 3)) &&
             ((uVar4 <= ((ulong)*(pointer)((long)local_120 + (ulong)local_34[0] * 8) & 0xffffffff)
              || (uVar4 <= (ulong)*(pointer)((long)local_120 + (ulong)local_34[0] * 8) >> 0x20)))) {
            this_01 = (VarException *)__cxa_allocate_exception(0x10);
            (*(((psVar9->super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_Var).super_IRNode._vptr_IRNode[0x1f])(&visitor.params_._M_h._M_single_bucket);
            slice_index.
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(ulong)local_34[0];
            visitor.super_IRVisitor._8_8_ = visitor.params_._M_h._M_single_bucket;
            bVar10 = fmt::v7::to_string_view<char,_0>
                               ("Unable to parameterize dim {0} due to usage of {1}");
            format_str.data_ = (char *)bVar10.size_;
            format_str.size_ = 0xd2;
            args.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1.args_ = in_R9.args_;
            args.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = (unsigned_long_long)
                     &slice_index.
                      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            fmt::v7::detail::vformat_abi_cxx11_(&local_60,(detail *)bVar10.data_,format_str,args);
            local_130 = (psVar9->super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr;
            local_128 = local_40;
            __l._M_len = 2;
            __l._M_array = (iterator)&local_130;
            std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                      ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                       &slice_index.
                        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,__l,&local_35);
            VarException::VarException
                      (this_01,&local_60,
                       (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                       &slice_index.
                        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            __cxa_throw(this_01,&VarException::typeinfo,std::runtime_error::~runtime_error);
          }
          std::
          _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ::~_Vector_base((_Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                           *)local_120);
        }
      }
      (local_40->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[local_34[0]] = (uint)uVar4;
      ppVVar5 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_kratos::Var_*>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_kratos::Var_*>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&local_40->size_param_,local_34);
      *ppVVar5 = param;
      visitor.super_IRVisitor._8_8_ =
           &visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
      visitor.super_IRVisitor._vptr_IRVisitor =
           (_func_int **)((ulong)visitor.super_IRVisitor._vptr_IRVisitor._4_4_ << 0x20);
      visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
      visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
      visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
      visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
      visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
      slice_index.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&PTR_visit_root_002abd20;
      visitor.super_IRVisitor.visited_._M_h._M_single_bucket =
           (__node_base_ptr)&visitor.params_._M_h._M_rehash_policy._M_next_resize;
      visitor.params_._M_h._M_buckets = (__buckets_ptr)0x1;
      visitor.params_._M_h._M_bucket_count = 0;
      visitor.params_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      visitor.params_._M_h._M_element_count._0_4_ = 0x3f800000;
      visitor.params_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      visitor.params_._M_h._M_rehash_policy._4_4_ = 0;
      visitor.params_._M_h._M_rehash_policy._M_next_resize = 0;
      IRVisitor::visit_root
                ((IRVisitor *)
                 &slice_index.
                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&param->super_IRNode);
      psVar8 = &visitor.params_._M_h._M_bucket_count;
      while (psVar8 = (size_type *)*psVar8, psVar8 != (size_type *)0x0) {
        Param::add_param_size_var
                  ((Param *)((__node_base *)(psVar8 + 1))->_M_nxt,pVVar2,local_34[0],param);
      }
    }
    ParamVisitor::~ParamVisitor
              ((ParamVisitor *)
               &slice_index.
                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    return;
  }
  pUVar7 = (UserException *)__cxa_allocate_exception(0x10);
  (*(this->super_IRNode)._vptr_IRNode[0x1f])(&visitor.params_._M_h._M_single_bucket,this);
  visitor.super_IRVisitor._8_8_ = ZEXT48(local_34[0]);
  slice_index.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)visitor.params_._M_h._M_single_bucket;
  bVar10 = fmt::v7::to_string_view<char,_0>("{0} does not have {1} dimension");
  format_str_00.data_ = (char *)bVar10.size_;
  format_str_00.size_ = 0x2d;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)
           &slice_index.
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  fmt::v7::detail::vformat_abi_cxx11_(&local_60,(detail *)bVar10.data_,format_str_00,args_00);
  UserException::UserException(pUVar7,&local_60);
  __cxa_throw(pUVar7,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Var::set_size_param(uint32_t index, Var *param) {
    if (type_ != VarType::Base && type_ != VarType::PortIO)
        throw UserException(::format("{0} is not a variable or port", to_string()));
    if (index >= size_.size())
        throw UserException(::format("{0} does not have {1} dimension", to_string(), index));

    if (param == nullptr) {
        if (size_param_.find(index) != size_param_.end()) {
            auto *linked_param = size_param_.at(index);
            // get all the parameters
            ParamVisitor visitor;
            visitor.visit_root(linked_param);
            auto const &params = visitor.params();
            for (const auto &p : params) {
                p->remove_param_size_var(this, index, linked_param);
            }
            size_param_.erase(index);
        }
        return;
    }

    auto new_dim_size = Simulator::static_evaluate_expr(param);

    // LCOV_EXCL_STOP
    for (auto const &slice : slices_) {
        if (!slice->sliced_by_var()) {
            auto slice_index = slice->get_slice_index();
            if (slice_index.size() > index) {
                auto [high, low] = slice_index[index];
                if (high >= new_dim_size || low >= new_dim_size)
                    throw VarException(
                        ::format("Unable to parameterize dim {0} due to usage of {1}", index,
                                 slice->to_string()),
                        {slice.get(), this});
            }
        }
    }
    // all good. now we need to resize the index
    size_[index] = new_dim_size;
    size_param_[index] = param;

    // get all the parameters
    ParamVisitor visitor;
    visitor.visit_root(param);
    auto const &params = visitor.params();
    for (const auto &p : params) {
        p->add_param_size_var(this, index, param);
    }
}